

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::OP_LoadUndefinedToElementScoped
               (FrameDisplay *pScope,PropertyId propertyId,Var defaultInstance,
               ScriptContext *scriptContext)

{
  uint16 uVar1;
  BOOL BVar2;
  ThreadContext *threadContext;
  void *instance;
  JavascriptLibrary *this;
  RecyclableObject *newValue;
  Var argInstance;
  uint local_4c;
  int length;
  int i;
  JsReentLock reentrancylock;
  ScriptContext *scriptContext_local;
  Var defaultInstance_local;
  PropertyId propertyId_local;
  FrameDisplay *pScope_local;
  
  reentrancylock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)&length,threadContext);
  uVar1 = FrameDisplay::GetLength(pScope);
  for (local_4c = 0; (int)local_4c < (int)(uint)uVar1; local_4c = local_4c + 1) {
    instance = FrameDisplay::GetItem(pScope,local_4c);
    BVar2 = EnsureProperty(instance,propertyId);
    if (BVar2 != 0) goto LAB_00fa7867;
  }
  BVar2 = HasOwnPropertyNoHostObject(defaultInstance,propertyId);
  if (BVar2 == 0) {
    this = ScriptContext::GetLibrary((ScriptContext *)reentrancylock._24_8_);
    newValue = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
    OP_InitPropertyScoped
              (pScope,propertyId,newValue,defaultInstance,(ScriptContext *)reentrancylock._24_8_);
  }
LAB_00fa7867:
  JsReentLock::~JsReentLock((JsReentLock *)&length);
  return;
}

Assistant:

void JavascriptOperators::OP_LoadUndefinedToElementScoped(FrameDisplay *pScope, PropertyId propertyId, Var defaultInstance, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_LdElemUndefScoped, reentrancylock, scriptContext->GetThreadContext());
        int i;
        int length = pScope->GetLength();
        Var argInstance;
        for (i = 0; i < length; i++)
        {
            argInstance = pScope->GetItem(i);
            if (JavascriptOperators::EnsureProperty(argInstance, propertyId))
            {
                return;
            }
        }

        if (!JavascriptOperators::HasOwnPropertyNoHostObject(defaultInstance, propertyId))
        {
            // CONSIDER : Consider adding pre-initialization support to activation objects.
            JavascriptOperators::OP_InitPropertyScoped(pScope, propertyId, scriptContext->GetLibrary()->GetUndefined(), defaultInstance, scriptContext);
        }
        JIT_HELPER_END(Op_LdElemUndefScoped);
    }